

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptConstantBufferType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  char *pcVar4;
  HlslParseContext *pHVar5;
  _func_int **pp_Var6;
  TIntermNode *nodeList;
  TType templateType;
  TQualifier local_130;
  TString local_e0;
  TType local_b8;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokConstantBuffer);
  if (!bVar1) {
    return false;
  }
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar1) {
    TType::TType(&local_b8,EbtVoid,EvqTemporary,1,0,0,false);
    local_130.semanticName = (char *)0x0;
    bVar1 = acceptType(this,&local_b8,(TIntermNode **)&local_130);
    if (bVar1) {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
      if (bVar1) {
        local_130.semanticName = (char *)0x0;
        local_130._16_1_ = local_130._16_1_ & 0xf0;
        local_130.layoutOffset = -1;
        local_130.layoutAlign = -1;
        local_130.layoutPushConstant = false;
        local_130.layoutBufferReference = false;
        local_130.layoutPassthrough = false;
        local_130.layoutViewportRelative = false;
        local_130.layoutSecondaryViewportRelativeOffset = -0x800;
        local_130.layoutShaderRecord = false;
        local_130.layoutFullQuads = false;
        local_130.layoutQuadDeriv = false;
        local_130.layoutHitObjectShaderRecordNV = false;
        local_130.layoutBindlessSampler = false;
        local_130.layoutBindlessImage = false;
        local_130._44_1_ = 0;
        local_130._28_8_ = local_130._28_8_ & 0xffffffdf8000 | 0xffffffff001fcfff;
        local_130._36_8_ = local_130._36_8_ | 0x1ffffff7fffffff;
        local_130.spirvStorageClass = -1;
        local_130.spirvDecorate = (TSpirvDecorate *)0x0;
        local_130._8_8_ = local_130._8_8_ & 0x400000000 | 5;
        bVar1 = (byte)local_b8._8_1_ - 0xf < 2;
        if (bVar1) {
          iVar2 = (*local_b8._vptr_TType[0x25])();
          if ((char)iVar2 != '\0') {
            local_e0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            local_e0._M_string_length = 0;
            local_e0.field_2._M_local_buf[0] = '\0';
            TType::TType(type,local_b8.field_13.structure,&local_e0,&local_130);
            iVar2 = (*type->_vptr_TType[10])(type);
            *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) =
                 *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) & 0xffffffffffffff80 | 5;
            return bVar1;
          }
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
        }
        pHVar5 = this->parseContext;
        pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar4 = "non-structure type in ConstantBuffer";
        pcVar3 = "";
        goto LAB_003a6c6f;
      }
      pHVar5 = this->parseContext;
      pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = "right angle bracket";
    }
    else {
      pHVar5 = this->parseContext;
      pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = "type";
    }
  }
  else {
    pHVar5 = this->parseContext;
    pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar3 = "left angle bracket";
  }
  pcVar4 = "Expected";
  bVar1 = false;
LAB_003a6c6f:
  (*pp_Var6[0x2d])(pHVar5,&(this->super_HlslTokenStream).token,pcVar4,pcVar3,"");
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptConstantBufferType(TType& type)
{
    if (! acceptTokenClass(EHTokConstantBuffer))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        expected("left angle bracket");
        return false;
    }
    
    TType templateType;
    if (! acceptType(templateType)) {
        expected("type");
        return false;
    }

    if (! acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    TQualifier postDeclQualifier;
    postDeclQualifier.clear();
    postDeclQualifier.storage = EvqUniform;

    if (templateType.isStruct()) {
        // Make a block from the type parsed as the template argument
        TTypeList* typeList = templateType.getWritableStruct();
        new(&type) TType(typeList, "", postDeclQualifier); // sets EbtBlock

        type.getQualifier().storage = EvqUniform;

        return true;
    } else {
        parseContext.error(token.loc, "non-structure type in ConstantBuffer", "", "");
        return false;
    }
}